

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_sink.c
# Opt level: O2

void lj_opt_sink(jit_State *J)

{
  byte *pbVar1;
  IROp1 IVar2;
  char cVar3;
  byte bVar4;
  byte bVar5;
  ushort uVar6;
  SnapShot *pSVar7;
  SnapEntry *pSVar8;
  int iVar9;
  IRIns *pIVar10;
  IRIns *pIVar11;
  IRIns *pIVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  IRRef ref;
  long lVar16;
  
  if (((~J->flags & 0x10f0000) != 0) ||
     ((((J->chain[0x51] == 0 && (J->chain[0x52] == 0)) && (J->chain[0x53] == 0)) &&
      (J->chain[0x54] == 0)))) {
    return;
  }
  if (J->loopref == 0) {
    pSVar7 = (J->cur).snap;
    uVar15 = (ulong)(J->cur).nsnap;
    uVar13 = pSVar7[uVar15 - 1].mapofs;
    pSVar8 = (J->cur).snapmap;
    bVar4 = pSVar7[uVar15 - 1].nent;
    for (uVar15 = 0; bVar4 != uVar15; uVar15 = uVar15 + 1) {
      uVar6 = (ushort)pSVar8[uVar13 + uVar15];
      if (0x7fff < uVar6) {
        pbVar1 = (byte *)((long)(J->cur).ir + (ulong)uVar6 * 8 + 4);
        *pbVar1 = *pbVar1 | 0x20;
      }
    }
  }
  pIVar12 = (J->cur).ir + ((J->cur).nins - 1);
LAB_001478ec:
  IVar2 = (pIVar12->field_1).o;
  switch(IVar2) {
  case 'B':
  case 'C':
  case 'F':
  case 'I':
  case 'X':
  case 'b':
  case 'c':
    goto switchD_00147900_caseD_42;
  case 'D':
  case 'G':
  case 'H':
  case 'O':
  case 'P':
  case 'Q':
  case 'R':
  case 'S':
  case 'U':
  case 'V':
  case 'W':
  case 'Y':
  case 'Z':
  case '[':
  case '\\':
  case ']':
  case '^':
  case '_':
  case '`':
  case 'a':
switchD_00147900_caseD_44:
    if (((pIVar12->field_1).t.irt & 0xa0) != 0) {
      if (0x8000 < (ulong)(pIVar12->field_0).op1) {
        pbVar1 = (byte *)((long)(J->cur).ir + (ulong)(pIVar12->field_0).op1 * 8 + 4);
        *pbVar1 = *pbVar1 | 0x20;
      }
      uVar13 = (uint)(pIVar12->field_0).op2;
      if ((pIVar12->field_0).op2 < 0x8001) goto LAB_001479b5;
      goto LAB_001479aa;
    }
    goto LAB_001479b5;
  case 'E':
    if ((((pIVar12->field_1).t.irt & 0x20) == 0) && ((pIVar12->field_0).op2 != 5))
    goto LAB_001479b5;
    goto switchD_00147900_caseD_42;
  case 'J':
  case 'K':
  case 'M':
  case 'N':
    pIVar10 = sink_checkalloc(J,pIVar12);
    if ((pIVar10 == (IRIns *)0x0) ||
       ((((pIVar10->field_1).t.irt & 0x40) != 0 &&
        (iVar9 = sink_checkphi(J,pIVar10,(uint)(pIVar12->field_0).op2), iVar9 == 0)))) {
      pbVar1 = (byte *)((long)(J->cur).ir + (ulong)(pIVar12->field_0).op1 * 8 + 4);
      *pbVar1 = *pbVar1 | 0x20;
    }
    break;
  case 'L':
    break;
  case 'T':
    if ((((pIVar12->field_1).t.irt & 0x40) != 0) &&
       (iVar9 = sink_checkphi(J,pIVar12,(uint)(pIVar12->field_0).op2), iVar9 == 0)) {
      (pIVar12->field_1).t.irt = (pIVar12->field_1).t.irt | 0x20;
    }
    break;
  default:
    if (IVar2 == '\x13') {
      pIVar10 = (J->cur).ir;
      uVar14 = (ulong)(pIVar12->field_0).op1;
      uVar15 = (ulong)(pIVar12->field_0).op2;
      *(undefined2 *)((long)pIVar10 + uVar15 * 8 + 6) = 0;
      *(undefined2 *)((long)pIVar10 + uVar14 * 8 + 6) = 0;
      cVar3 = *(char *)((long)pIVar10 + uVar14 * 8 + 5);
      if (cVar3 == *(char *)((long)pIVar10 + uVar15 * 8 + 5) && (byte)(cVar3 + 0xafU) < 4)
      goto LAB_001479b5;
      pIVar11 = pIVar10 + uVar15;
      pbVar1 = (byte *)((long)pIVar10 + uVar14 * 8 + 4);
      *pbVar1 = *pbVar1 | 0x20;
      goto LAB_001479b1;
    }
    if (IVar2 != '\r') goto switchD_00147900_caseD_44;
    uVar13 = J->loopref;
    while (uVar13 != 0) {
      uVar13 = 0;
      for (pIVar12 = (J->cur).ir + ((J->cur).nins - 1); (pIVar12->field_1).o == '\x13';
          pIVar12 = pIVar12 + -1) {
        pIVar10 = (J->cur).ir;
        uVar15 = (ulong)(pIVar12->field_0).op1;
        bVar4 = *(byte *)((long)pIVar10 + uVar15 * 8 + 4);
        bVar5 = *(byte *)((long)pIVar10 + (ulong)(pIVar12->field_0).op2 * 8 + 4);
        if ((((bVar5 ^ bVar4) & 0x20) != 0) ||
           (*(short *)((long)pIVar10 + uVar15 * 8 + 6) !=
            *(short *)((long)pIVar10 + (ulong)(pIVar12->field_0).op2 * 8 + 6))) {
          uVar13 = uVar13 | ~(bVar5 & bVar4) & 0x20;
          *(byte *)((long)pIVar10 + uVar15 * 8 + 4) = bVar4 | 0x20;
          pbVar1 = (byte *)((long)(J->cur).ir + (ulong)(pIVar12->field_0).op2 * 8 + 4);
          *pbVar1 = *pbVar1 | 0x20;
        }
      }
    }
    pIVar12 = (J->cur).ir;
    lVar16 = (ulong)((J->cur).nins - 1) << 3;
    do {
      if (lVar16 < 0x40000) {
        for (pIVar10 = (J->cur).ir + (J->cur).nk; pIVar10 < pIVar12 + 0x8000; pIVar10 = pIVar10 + 1)
        {
          uVar13._0_2_ = *(IROpT *)((long)pIVar10 + 4);
          uVar13._2_2_ = *(IRRef1 *)((long)pIVar10 + 6);
          (pIVar10->field_1).t.irt = (byte)(undefined2)uVar13 & 0xdf;
          (pIVar10->field_0).prev = 0xff;
          if ((0x605fd9U >> (uVar13 & 0x1f) & 1) != 0) {
            pIVar10 = pIVar10 + ((pIVar10->field_1).o != '\x1b');
          }
        }
        return;
      }
      bVar4 = *(byte *)((long)pIVar12 + lVar16 + 5);
      uVar13 = bVar4 - 0x3b;
      if (uVar13 < 0x1a) {
        pIVar10 = (IRIns *)((long)pIVar12 + lVar16);
        if ((0xd8000U >> (uVar13 & 0x1f) & 1) == 0) {
          if ((0x3c00000U >> (uVar13 & 0x1f) & 1) == 0) {
            if (uVar13 != 0) goto LAB_00147b5c;
            if ((*(byte *)((long)(J->cur).ir + (ulong)(pIVar10->field_0).op1 * 8 + 4) & 0x20) == 0)
            goto LAB_00147b7c;
            goto LAB_00147b86;
          }
          bVar4 = *(byte *)((long)pIVar12 + lVar16 + 4);
          if ((bVar4 & 0x20) != 0) {
            *(byte *)((long)pIVar12 + lVar16 + 4) = bVar4 & 0xdf;
            goto LAB_00147b8c;
          }
          *(byte *)((long)pIVar12 + lVar16 + 4) = bVar4 & 0x5f;
          *(undefined2 *)((long)pIVar12 + lVar16 + 6) = 0xfe;
          (J->cur).sinktags = '\x01';
        }
        else {
          pIVar11 = sink_checkalloc(J,pIVar10);
          if ((pIVar11 == (IRIns *)0x0) || (((pIVar11->field_1).t.irt & 0x20) != 0))
          goto LAB_00147b8c;
          iVar9 = (int)((ulong)((long)pIVar10 - (long)pIVar11) >> 3);
          if (0xfe < iVar9) {
            iVar9 = 0xff;
          }
          *(ushort *)((long)pIVar12 + lVar16 + 6) = (ushort)(iVar9 << 8) | 0xfe;
        }
      }
      else {
LAB_00147b5c:
        if (bVar4 == 0x13) {
          pIVar10 = (J->cur).ir;
          uVar15 = (ulong)*(ushort *)((long)pIVar12 + lVar16 + 2);
          if (((*(byte *)((long)pIVar10 + uVar15 * 8 + 4) & 0x20) != 0) ||
             (3 < (byte)(*(char *)((long)pIVar10 + uVar15 * 8 + 5) + 0xafU))) goto LAB_00147b8c;
LAB_00147b7c:
          *(undefined2 *)((long)pIVar12 + lVar16 + 6) = 0xfe;
        }
        else {
LAB_00147b86:
          pbVar1 = (byte *)((long)pIVar12 + lVar16 + 4);
          *pbVar1 = *pbVar1 & 0xdf;
LAB_00147b8c:
          *(undefined2 *)((long)pIVar12 + lVar16 + 6) = 0xff;
        }
      }
      lVar16 = lVar16 + -8;
    } while( true );
  }
  uVar13 = (uint)(pIVar12->field_0).op2;
LAB_001479aa:
  pIVar11 = (IRIns *)((ulong)(uVar13 << 3) + (long)(J->cur).ir);
LAB_001479b1:
  (pIVar11->field_1).t.irt = (pIVar11->field_1).t.irt | 0x20;
LAB_001479b5:
  pIVar12 = pIVar12 + -1;
  goto LAB_001478ec;
switchD_00147900_caseD_42:
  uVar13 = (uint)(pIVar12->field_0).op1;
  goto LAB_001479aa;
}

Assistant:

void lj_opt_sink(jit_State *J)
{
  const uint32_t need = (JIT_F_OPT_SINK|JIT_F_OPT_FWD|
			 JIT_F_OPT_DCE|JIT_F_OPT_CSE|JIT_F_OPT_FOLD);
  if ((J->flags & need) == need &&
      (J->chain[IR_TNEW] || J->chain[IR_TDUP] ||
       (LJ_HASFFI && (J->chain[IR_CNEW] || J->chain[IR_CNEWI])))) {
    if (!J->loopref)
      sink_mark_snap(J, &J->cur.snap[J->cur.nsnap-1]);
    sink_mark_ins(J);
    if (J->loopref)
      sink_remark_phi(J);
    sink_sweep_ins(J);
  }
}